

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetTXToolInfo(ndicapi *pol,int ph)

{
  uint uVar1;
  int iVar2;
  unsigned_long uVar3;
  ulong uVar4;
  
  uVar1 = pol->TxHandleCount;
  iVar2 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = 0;
    do {
      if ((uint)pol->TxHandles[uVar4] == ph) goto LAB_0010927b;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    uVar4 = (ulong)uVar1;
  }
LAB_0010927b:
  if ((uint)uVar4 != uVar1) {
    uVar3 = ndiHexToUnsignedLong(pol->TxInformation[uVar4 & 0xffffffff],2);
    iVar2 = (int)uVar3;
  }
  return iVar2;
}

Assistant:

ndicapiExport int ndiGetTXToolInfo(ndicapi* pol, int ph)
{
  char* dp;
  int i, n;

  n = pol->TxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->TxHandles[i] == ph)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  dp = pol->TxInformation[i];
  return (int)ndiHexToUnsignedLong(dp, 2);
}